

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilities.h
# Opt level: O3

Fatal * __thiscall wasm::Fatal::operator<<(Fatal *this,char **arg)

{
  undefined1 *puVar1;
  char *__s;
  size_t sVar2;
  
  puVar1 = &this->field_0x10;
  __s = *arg;
  if (__s == (char *)0x0) {
    std::ios::clear((int)puVar1 + (int)*(undefined8 *)(*(long *)puVar1 + -0x18));
  }
  else {
    sVar2 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar1,__s,sVar2);
  }
  return this;
}

Assistant:

Fatal& operator<<(T&& arg) {
    buffer << arg;
    return *this;
  }